

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

mat<double,_3,_3> * linalg::adjugate<double>(mat<double,_3,_3> *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  mat<double,_3,_3> *in_RDI;
  
  dVar1 = (a->y).y;
  dVar2 = (a->x).x;
  dVar3 = (a->x).y;
  dVar4 = (a->z).y;
  dVar5 = (a->z).z;
  dVar6 = (a->y).z;
  dVar7 = (a->z).x;
  dVar8 = (a->x).z;
  dVar9 = (a->y).x;
  (in_RDI->x).x = dVar1 * dVar5 - dVar6 * dVar4;
  (in_RDI->x).y = dVar8 * dVar4 - dVar5 * dVar3;
  (in_RDI->x).z = dVar3 * dVar6 - dVar1 * dVar8;
  (in_RDI->y).x = dVar6 * dVar7 - dVar5 * dVar9;
  (in_RDI->y).y = dVar2 * dVar5 - dVar8 * dVar7;
  (in_RDI->y).z = dVar9 * dVar8 - dVar6 * dVar2;
  (in_RDI->z).x = dVar9 * dVar4 - dVar1 * dVar7;
  (in_RDI->z).y = dVar7 * dVar3 - dVar4 * dVar2;
  (in_RDI->z).z = dVar2 * dVar1 - dVar9 * dVar3;
  return in_RDI;
}

Assistant:

constexpr linalg::mat<T,3,3> linalg::adjugate(const mat<T,3,3> & a) 
{
    return {{a.y.y*a.z.z - a.z.y*a.y.z, a.z.y*a.x.z - a.x.y*a.z.z, a.x.y*a.y.z - a.y.y*a.x.z},
            {a.y.z*a.z.x - a.z.z*a.y.x, a.z.z*a.x.x - a.x.z*a.z.x, a.x.z*a.y.x - a.y.z*a.x.x},
            {a.y.x*a.z.y - a.z.x*a.y.y, a.z.x*a.x.y - a.x.x*a.z.y, a.x.x*a.y.y - a.y.x*a.x.y}}; 
}